

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,string *p)

{
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_40;
  undefined1 local_20;
  
  this->pos = 0;
  this->line_number = 1;
  this->col_number = 0;
  (this->current_line)._M_dataplus._M_p = (pointer)&(this->current_line).field_2;
  (this->current_line)._M_string_length = 0;
  (this->current_line).field_2._M_local_buf[0] = '\0';
  (this->header_block_name)._M_dataplus._M_p = (pointer)&(this->header_block_name).field_2;
  (this->header_block_name)._M_string_length = 0;
  (this->header_block_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->program,(string *)p);
  local_40._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_20 = 0;
  (this->currentToken).type = Empty;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&(this->currentToken).value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&local_40._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_40._M_first);
  return;
}

Assistant:

Tokenizer::Tokenizer(string p) : program(std::move(p)), currentToken(Token(Empty, 0)), pos(0), line_number(1),
                                 col_number(0) {}